

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exception.hpp
# Opt level: O3

void __thiscall
duckdb::InvalidInputException::InvalidInputException<unsigned_char,unsigned_char>
          (InvalidInputException *this,string *msg,uchar params,uchar params_1)

{
  undefined7 in_register_00000011;
  uchar in_R8B;
  string local_30;
  
  Exception::ConstructMessage<unsigned_char,unsigned_char>
            (&local_30,(Exception *)msg,(string *)CONCAT71(in_register_00000011,params),params_1,
             in_R8B);
  InvalidInputException(this,&local_30);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return;
}

Assistant:

explicit InvalidInputException(const string &msg, ARGS... params)
	    : InvalidInputException(ConstructMessage(msg, params...)) {
	}